

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  int odd;
  void *pvVar1;
  char *pcVar2;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe x;
  secp256k1_fe xd;
  secp256k1_ge p;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/ellswift/main_impl.h"
            ,0x1ec,"test condition failed: ctx != NULL");
    abort();
  }
  if (pubkey == (secp256k1_pubkey *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "pubkey != NULL";
  }
  else {
    if (ell64 != (uchar *)0x0) {
      secp256k1_fe_set_b32_mod(&u,ell64);
      secp256k1_fe_set_b32_mod(&t,ell64 + 0x20);
      secp256k1_fe_normalize_var(&t);
      secp256k1_ellswift_xswiftec_frac_var(&p.x,&xd,&u,&t);
      secp256k1_fe_inv_var(&xd,&xd);
      secp256k1_fe_mul(&x,&p.x,&xd);
      odd = secp256k1_fe_is_odd(&t);
      secp256k1_ge_set_xo_var(&p,&x,odd);
      secp256k1_ge_to_bytes(pubkey->data,&p);
      return 1;
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "ell64 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}